

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmEnableTestingCommand.cxx
# Opt level: O3

bool __thiscall
cmEnableTestingCommand::InitialPass
          (cmEnableTestingCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_1,cmExecutionStatus *param_2)

{
  cmMakefile *this_00;
  string local_38;
  
  this_00 = (this->super_cmCommand).Makefile;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CMAKE_TESTING_ENABLED","");
  cmMakefile::AddDefinition(this_00,&local_38,"1");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool cmEnableTestingCommand::InitialPass(std::vector<std::string> const&,
                                         cmExecutionStatus&)
{
  this->Makefile->AddDefinition("CMAKE_TESTING_ENABLED", "1");
  return true;
}